

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O3

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<int>(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
              *this,int aValue,int aBase,uint8_t aFill)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Iterator pcVar4;
  char *pcVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  Iterator pcVar9;
  ulong uVar10;
  ulong uVar11;
  char tmpBuffer [100];
  
  if (0xfffffff0 < aBase - 0x11U) {
    if (aBase == 0x10) {
      pcVar4 = this->mBegin;
      pcVar9 = this->mEnd;
      if (pcVar4 < pcVar9) {
        *pcVar4 = '0';
        pcVar9 = this->mEnd;
        pcVar4 = this->mBegin + 1;
        this->mBegin = pcVar4;
      }
      if (pcVar4 < pcVar9) {
        *pcVar4 = 'x';
        goto LAB_00104012;
      }
    }
    else if (aBase != 10) {
      if (aBase == 2) {
        pcVar4 = this->mBegin;
        pcVar9 = this->mEnd;
        if (pcVar4 < pcVar9) {
          *pcVar4 = '0';
          pcVar9 = this->mEnd;
          pcVar4 = this->mBegin + 1;
          this->mBegin = pcVar4;
        }
        if (pcVar4 < pcVar9) {
          *pcVar4 = 'b';
LAB_00104012:
          this->mBegin = this->mBegin + 1;
        }
      }
      else {
        pcVar4 = this->mBegin;
        pcVar9 = this->mEnd;
        if (pcVar4 < pcVar9) {
          *pcVar4 = '0';
          pcVar9 = this->mEnd;
          pcVar4 = this->mBegin + 1;
          this->mBegin = pcVar4;
        }
        if (pcVar4 < pcVar9) {
          *pcVar4 = '!';
          goto LAB_00104012;
        }
      }
    }
    uVar10 = 0;
    iVar2 = aValue;
    do {
      uVar11 = uVar10;
      iVar3 = iVar2 / aBase;
      uVar8 = iVar2 % aBase;
      uVar1 = -uVar8;
      if (0 < (int)uVar8) {
        uVar1 = uVar8;
      }
      tmpBuffer[uVar11] = "0123456789abcdef"[uVar1];
      uVar10 = uVar11 + 1;
    } while ((uVar11 < 99) && (iVar2 = iVar3, iVar3 != 0));
    if (uVar11 < 99) {
      if ((aValue < 0) && (this->mBegin < this->mEnd)) {
        *this->mBegin = '-';
        this->mBegin = this->mBegin + 1;
      }
      if ((byte)uVar10 < aFill) {
        pcVar5 = this->mBegin;
        if (aFill != (byte)uVar10) {
          uVar7 = aFill - uVar10;
          do {
            if (pcVar5 < this->mEnd) {
              *pcVar5 = '0';
              pcVar5 = this->mBegin + 1;
              this->mBegin = pcVar5;
            }
            bVar6 = (char)uVar7 - 1;
            uVar7 = (ulong)bVar6;
          } while (bVar6 != 0);
        }
      }
      else {
        pcVar5 = this->mBegin;
      }
      if (uVar10 != 1) {
        do {
          uVar10 = uVar11 - 1;
          if (pcVar5 < this->mEnd) {
            *pcVar5 = tmpBuffer[uVar11];
            pcVar5 = this->mBegin + 1;
            this->mBegin = pcVar5;
          }
          uVar11 = uVar10;
        } while ((char)uVar10 != '\0');
      }
      if (this->mEnd <= pcVar5) {
        return;
      }
      *pcVar5 = tmpBuffer[0];
      goto LAB_001040e0;
    }
  }
  if (this->mEnd <= this->mBegin) {
    return;
  }
  *this->mBegin = '#';
LAB_001040e0:
  this->mBegin = this->mBegin + 1;
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }